

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_depth_decomposition.h
# Opt level: O1

ArrayIDIDFunc *
compute_tree_depth_order_of_connected_graph<main::__0>
          (ArrayIDIDFunc *__return_storage_ptr__,ArrayIDIDFunc *tail,ArrayIDIDFunc *head,
          anon_class_8_1_f6d195b4 *compute_separator,int tree_depth_must_be_below)

{
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint *puVar8;
  ArrayIDIDFunc *tail_00;
  ArrayIDIDFunc *head_00;
  undefined1 auVar9 [64];
  int iVar10;
  bool bVar11;
  int iVar12;
  int *piVar13;
  void *__s;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int node_end;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  int best_order_depth;
  int order_end;
  ArrayIDIDFunc nd_order;
  ArrayIDIDFunc best_order;
  ArrayIDIDFunc sub_tail;
  vector<int,_std::allocator<int>_> separator_node_depth;
  vector<int,_std::allocator<int>_> separator;
  ArrayIDFunc<int> depth;
  ArrayIDIDFunc sub_to_super;
  ArrayIDIDFunc sub_head;
  BitIDFunc is_in_separator;
  ArrayIDIDMultiFunc successor;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  void *local_1a8;
  ulong local_1a0;
  ArrayIDIDFunc local_198;
  ArrayIDIDFunc local_180;
  ArrayIDIDFunc local_168;
  anon_class_32_4_d72f82c3 local_150;
  ArrayIDIDFunc *local_130;
  vector<int,_std::allocator<int>_> local_128;
  ArrayIDFunc<int> local_110;
  ArrayIDIDFunc local_100;
  ArrayIDIDFunc local_e8;
  TinyIntIDFunc<1> local_d0;
  uint *local_b8;
  ArrayIDIDFunc *local_b0;
  ArrayIDIDFunc *local_a8;
  uint *local_a0;
  long local_98;
  anon_class_32_4_7ef0cc76 local_90;
  anon_class_24_3_8acad44f local_70;
  ArrayIDIDMultiFunc local_58;
  undefined1 auVar27 [32];
  
  iVar12 = (tail->super_ArrayIDFunc<int>).preimage_count_;
  iVar18 = tail->image_count_;
  local_1b0 = tree_depth_must_be_below;
  if (iVar12 == iVar18 * 2 + -2) {
    compute_tree_depth_order_of_tree<ArrayIDIDFunc,ArrayIDIDFunc>(__return_storage_ptr__,tail,head);
    return __return_storage_ptr__;
  }
  if (iVar12 == (iVar18 + -1) * iVar18) {
    (__return_storage_ptr__->super_ArrayIDFunc<int>).preimage_count_ = iVar18;
    if (iVar18 == 0) {
      piVar13 = (int *)0x0;
    }
    else {
      uVar16 = 0xffffffffffffffff;
      if (-1 < iVar18) {
        uVar16 = (long)iVar18 << 2;
      }
      piVar13 = (int *)operator_new__(uVar16);
    }
    (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = piVar13;
    __return_storage_ptr__->image_count_ = iVar18;
    if (iVar18 < 1) {
      return __return_storage_ptr__;
    }
    piVar13 = (__return_storage_ptr__->super_ArrayIDFunc<int>).data_;
    auVar22 = vpbroadcastq_avx512vl();
    auVar23 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar2 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    lVar14 = 0;
    auVar25._8_8_ = 8;
    auVar25._0_8_ = 8;
    auVar25._16_8_ = 8;
    auVar25._24_8_ = 8;
    auVar24._8_4_ = 8;
    auVar24._0_8_ = 0x800000008;
    auVar24._12_4_ = 8;
    auVar24._16_4_ = 8;
    auVar24._20_4_ = 8;
    auVar24._24_4_ = 8;
    auVar24._28_4_ = 8;
    do {
      vpcmpuq_avx512vl(auVar3,auVar22,2);
      vpcmpuq_avx512vl(auVar23,auVar22,2);
      auVar30 = vmovdqu32_avx512vl(auVar2);
      *(undefined1 (*) [32])((long)piVar13 + lVar14) = auVar30;
      auVar3 = vpaddq_avx2(auVar3,auVar25);
      auVar23 = vpaddq_avx2(auVar23,auVar25);
      auVar2 = vpaddd_avx2(auVar2,auVar24);
      lVar14 = lVar14 + 0x20;
    } while ((ulong)(iVar18 + 7U >> 3) << 5 != lVar14);
    return __return_storage_ptr__;
  }
  compute_greedy_order(&local_180,tail,head);
  local_1b4 = compute_tree_depth_of_order(tail,head,&local_180);
  iVar12 = local_1b0;
  if (local_1b4 < local_1b0) {
    iVar12 = local_1b4;
  }
  compute_separator_by_running_bfs<std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
            (&local_128,tail,head,iVar12 + -1,compute_separator->rand_gen);
  local_a0 = (uint *)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
  if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) goto LAB_0011a9de;
  local_b8 = (uint *)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
  local_70.tree_depth_must_be_below = &local_1b0;
  local_70.best_order_depth = &local_1b4;
  iVar12 = tail->image_count_;
  local_70.compute_separator = (FastComputeSeparator *)compute_separator;
  compute_successor_function<ArrayIDIDFunc,ArrayIDIDFunc>(&local_58,tail,head);
  uVar19 = iVar12 + 0x7e;
  uVar20 = iVar12 + 0x3fU;
  if ((int)(iVar12 + 0x3fU) < 0) {
    uVar20 = uVar19;
  }
  iVar18 = (int)uVar20 >> 6;
  local_d0.preimage_ = iVar12;
  local_d0.data_.preimage_count_ = iVar18;
  if (uVar19 < 0x7f) {
    local_d0.data_.data_ = (unsigned_long *)0x0;
  }
  else {
    uVar16 = 0xffffffffffffffff;
    if (-0x7f < iVar12) {
      uVar16 = (long)iVar18 << 3;
    }
    local_d0.data_.data_ = (unsigned_long *)operator_new__(uVar16);
  }
  puVar8 = (uint *)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if (0x7e < uVar19) {
    memset(local_d0.data_.data_,0,(long)iVar18 << 3);
    puVar8 = (uint *)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  for (; puVar8 != (uint *)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish; puVar8 = puVar8 + 1) {
    uVar19 = *puVar8;
    uVar20 = uVar19 + 0x3f;
    if (-1 < (int)uVar19) {
      uVar20 = uVar19;
    }
    local_d0.data_.data_[(int)uVar20 >> 6] =
         (ulong)(~(uint)(local_d0.data_.data_[(int)uVar20 >> 6] >> ((ulong)uVar19 & 0x3f)) & 1) <<
         ((ulong)uVar19 & 0x3f) ^ local_d0.data_.data_[(int)uVar20 >> 6];
  }
  ArrayIDFunc<int>::ArrayIDFunc(&local_168.super_ArrayIDFunc<int>,&tail->super_ArrayIDFunc<int>);
  local_168.image_count_ = tail->image_count_;
  ArrayIDFunc<int>::ArrayIDFunc(&local_e8.super_ArrayIDFunc<int>,&head->super_ArrayIDFunc<int>);
  lVar14 = (long)iVar12;
  local_e8.image_count_ = head->image_count_;
  local_100.super_ArrayIDFunc<int>.preimage_count_ = iVar12;
  if (iVar12 == 0) {
    local_100.super_ArrayIDFunc<int>.data_ = (int *)0x0;
  }
  else {
    uVar16 = 0xffffffffffffffff;
    if (-1 < iVar12) {
      uVar16 = lVar14 * 4;
    }
    local_100.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar16);
  }
  if (0 < iVar12) {
    auVar22 = vpbroadcastq_avx512vl();
    auVar23 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar2 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    lVar15 = 0;
    auVar30._8_8_ = 8;
    auVar30._0_8_ = 8;
    auVar30._16_8_ = 8;
    auVar30._24_8_ = 8;
    auVar32._8_4_ = 8;
    auVar32._0_8_ = 0x800000008;
    auVar32._12_4_ = 8;
    auVar32._16_4_ = 8;
    auVar32._20_4_ = 8;
    auVar32._24_4_ = 8;
    auVar32._28_4_ = 8;
    do {
      vpcmpuq_avx512vl(auVar3,auVar22,2);
      vpcmpuq_avx512vl(auVar23,auVar22,2);
      auVar25 = vmovdqu32_avx512vl(auVar2);
      *(undefined1 (*) [32])((long)local_100.super_ArrayIDFunc<int>.data_ + lVar15) = auVar25;
      auVar3 = vpaddq_avx2(auVar3,auVar30);
      auVar23 = vpaddq_avx2(auVar23,auVar30);
      auVar2 = vpaddd_avx2(auVar2,auVar32);
      lVar15 = lVar15 + 0x20;
    } while ((ulong)(iVar12 + 7U >> 3) << 5 != lVar15);
  }
  local_100.image_count_ = iVar12;
  inplace_remove_nodes_incident_to_node_set<TinyIntIDFunc<1>>
            (&local_168,&local_e8,&local_100,&local_d0);
  inplace_reorder_nodes_and_arc_in_preorder(&local_168,&local_e8,&local_100);
  local_110.preimage_count_ = iVar12;
  if (iVar12 == 0) {
    local_110.data_ = (int *)0x0;
  }
  else {
    uVar16 = 0xffffffffffffffff;
    if (-1 < iVar12) {
      uVar16 = lVar14 * 4;
    }
    local_110.data_ = (int *)operator_new__(uVar16);
  }
  local_198.super_ArrayIDFunc<int>.preimage_count_ = iVar12;
  if (iVar12 == 0) {
LAB_0011a3ce:
    local_198.super_ArrayIDFunc<int>.data_ = (int *)0x0;
  }
  else {
    auVar23 = vpbroadcastq_avx512vl();
    lVar15 = 0;
    auVar2 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar22._8_4_ = 1;
    auVar22._0_8_ = 0x100000001;
    auVar22._12_4_ = 1;
    auVar22._16_4_ = 1;
    auVar22._20_4_ = 1;
    auVar22._24_4_ = 1;
    auVar22._28_4_ = 1;
    do {
      auVar24 = vpbroadcastq_avx512vl();
      auVar25 = vpor_avx2(auVar24,auVar2);
      auVar24 = vpor_avx2(auVar24,auVar3);
      vpcmpuq_avx512vl(auVar24,auVar23,2);
      vpcmpuq_avx512vl(auVar25,auVar23,2);
      auVar25 = vmovdqu32_avx512vl(auVar22);
      *(undefined1 (*) [32])(local_110.data_ + lVar15) = auVar25;
      lVar15 = lVar15 + 8;
    } while (((lVar14 + 0x3fffffffffffffffU & 0x3fffffffffffffff) -
             (ulong)((uint)(lVar14 + 0x3fffffffffffffffU) & 7)) + 8 != lVar15);
    if (iVar12 == 0) goto LAB_0011a3ce;
    uVar16 = 0xffffffffffffffff;
    if (-1 < iVar12) {
      uVar16 = lVar14 << 2;
    }
    local_198.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar16);
  }
  iVar18 = local_168.image_count_;
  local_90.order = &local_198;
  local_90.order_end = &local_1ac;
  local_1ac = 0;
  local_90.compute_order_of_part = &local_70;
  local_90.depth = &local_110;
  local_1a0 = (ulong)(uint)local_168.super_ArrayIDFunc<int>.preimage_count_;
  uVar19 = local_168.image_count_ + 0x7e;
  uVar20 = local_168.image_count_ + 0x3fU;
  if ((int)(local_168.image_count_ + 0x3fU) < 0) {
    uVar20 = uVar19;
  }
  local_198.image_count_ = iVar12;
  local_130 = tail;
  if (uVar19 < 0x7f) {
    __s = (void *)0x0;
  }
  else {
    uVar16 = 0xffffffffffffffff;
    if (-0x7f < local_168.image_count_) {
      uVar16 = (long)((int)uVar20 >> 6) << 3;
    }
    __s = operator_new__(uVar16);
  }
  if (0x7e < uVar19) {
    memset(__s,0xff,(long)((int)uVar20 >> 6) << 3);
  }
  local_150.tail = &local_168;
  local_150.head = &local_e8;
  local_150.input_node_id = &local_100;
  if (0 < (int)local_1a0) {
    uVar16 = 0;
    do {
      uVar19 = local_168.super_ArrayIDFunc<int>.data_[uVar16];
      if (local_e8.super_ArrayIDFunc<int>.data_[uVar16] < (int)uVar19) {
        uVar20 = uVar19 + 0x3f;
        if (-1 < (int)uVar19) {
          uVar20 = uVar19;
        }
        uVar17 = *(ulong *)((long)__s + (long)((int)uVar20 >> 6) * 8);
        *(ulong *)((long)__s + (long)((int)uVar20 >> 6) * 8) =
             (ulong)((uint)(uVar17 >> ((ulong)uVar19 & 0x3f)) & 1) << ((ulong)uVar19 & 0x3f) ^
             uVar17;
      }
      uVar16 = uVar16 + 1;
    } while (local_1a0 != uVar16);
  }
  local_150.callback = &local_90;
  iVar12 = 0;
  bVar1 = 1 < iVar18;
  local_b0 = head;
  local_a8 = __return_storage_ptr__;
  if (iVar18 < 2) {
    uVar19 = 0;
  }
  else {
    local_98 = (long)(int)local_1a0;
    uVar19 = 0;
    uVar16 = 1;
    iVar12 = 0;
    local_1a8 = __s;
    do {
      node_end = (int)uVar16;
      uVar20 = uVar19;
      iVar10 = iVar12;
      if ((*(ulong *)((long)__s + (uVar16 >> 6) * 8) >> (uVar16 & 0x3f) & 1) != 0) {
        uVar16 = (ulong)uVar19;
        if ((int)uVar19 < (int)local_1a0) {
          lVar14 = 0;
          do {
            if (node_end <= local_168.super_ArrayIDFunc<int>.data_[(int)uVar19 + lVar14]) {
              uVar16 = (ulong)((int)lVar14 + uVar19);
              break;
            }
            lVar14 = lVar14 + 1;
            uVar16 = local_1a0;
          } while (local_98 - (int)uVar19 != lVar14);
        }
        bVar11 = forall_connected_components_with_nodes_and_arcs_in_preorder<ArrayIDIDFunc,_ArrayIDIDFunc,_ArrayIDIDFunc,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ben-strasser[P]flow-cutter-pace20/src/tree_depth_decomposition.h:285:9)>
                 ::anon_class_32_4_d72f82c3::operator()
                           (&local_150,iVar12,node_end,uVar19,(uint)uVar16);
        __s = local_1a8;
        uVar20 = (uint)uVar16;
        iVar10 = node_end;
        if (!bVar11) break;
      }
      iVar12 = iVar10;
      uVar19 = uVar20;
      uVar20 = node_end + 1;
      uVar16 = (ulong)uVar20;
      bVar1 = (int)uVar20 < iVar18;
    } while (uVar20 != iVar18);
  }
  if (!bVar1) {
    forall_connected_components_with_nodes_and_arcs_in_preorder<ArrayIDIDFunc,_ArrayIDIDFunc,_ArrayIDIDFunc,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ben-strasser[P]flow-cutter-pace20/src/tree_depth_decomposition.h:285:9)>
    ::anon_class_32_4_d72f82c3::operator()(&local_150,iVar12,iVar18,uVar19,(int)local_1a0);
  }
  puVar8 = local_a0;
  __return_storage_ptr__ = local_a8;
  head_00 = local_b0;
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  if (local_198.super_ArrayIDFunc<int>.preimage_count_ != 0) {
    uVar19 = (uint)((ulong)((long)puVar8 - (long)local_b8) >> 2);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_150,(long)(int)uVar19,
               (allocator_type *)&local_90);
    if (0 < (int)uVar19) {
      uVar16 = 0;
      auVar2 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      do {
        iVar12 = local_58.preimage_to_intermediate.range_begin.data_
                 [local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar16]];
        iVar18 = 0;
        if (iVar12 != local_58.preimage_to_intermediate.range_begin.data_
                      [(long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar16] + 1]) {
          auVar23 = vpbroadcastq_avx512vl();
          auVar23 = vpsrlq_avx2(auVar23,2);
          uVar17 = 0;
          auVar9 = ZEXT1664((undefined1  [16])0x0);
          do {
            auVar28 = auVar9;
            auVar25 = vpbroadcastq_avx512vl();
            auVar22 = vpor_avx2(auVar25,auVar2);
            auVar25 = vpor_avx2(auVar25,auVar3);
            uVar4 = vpcmpuq_avx512vl(auVar25,auVar23,2);
            bVar7 = (byte)uVar4;
            uVar4 = vpcmpuq_avx512vl(auVar22,auVar23,2);
            bVar6 = (byte)uVar4;
            bVar5 = bVar6 << 4;
            vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                (local_58.intermediate_to_image.super_ArrayIDFunc<int>.data_ +
                                (long)iVar12 + uVar17));
            auVar22 = vpgatherdd_avx512vl(*local_110.data_);
            auVar26._4_4_ = (uint)((bVar7 & 2) >> 1) * auVar22._4_4_;
            auVar26._0_4_ = (uint)(bVar7 & 1) * auVar22._0_4_;
            auVar26._8_4_ = (uint)((bVar7 & 4) >> 2) * auVar22._8_4_;
            auVar26._12_4_ = (uint)((bVar7 & 0xf) >> 3) * auVar22._12_4_;
            auVar26._16_4_ = (uint)(bVar6 & 1) * auVar22._16_4_;
            auVar26._20_4_ = (uint)(bVar5 >> 5 & 1) * auVar22._20_4_;
            auVar26._24_4_ = (uint)(bVar5 >> 6 & 1) * auVar22._24_4_;
            auVar26._28_4_ = (uint)(bVar5 >> 7) * auVar22._28_4_;
            auVar22 = vpmaxsd_avx2(auVar26,auVar28._0_32_);
            uVar17 = uVar17 + 8;
            auVar9 = ZEXT3264(auVar22);
          } while (((((long)local_58.preimage_to_intermediate.range_begin.data_
                            [(long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar16] + 1] * 4 +
                     (long)iVar12 * -4) - 4U >> 2) + 8 & 0xfffffffffffffff8) != uVar17);
          auVar23 = vmovdqa32_avx512vl(auVar22);
          auVar21._0_4_ =
               (uint)(bVar7 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar28._0_4_;
          bVar1 = (bool)((bVar7 & 2) >> 1);
          auVar21._4_4_ = (uint)bVar1 * auVar23._4_4_ | (uint)!bVar1 * auVar28._4_4_;
          bVar1 = (bool)((bVar7 & 4) >> 2);
          auVar21._8_4_ = (uint)bVar1 * auVar23._8_4_ | (uint)!bVar1 * auVar28._8_4_;
          bVar1 = (bool)((bVar7 & 0xf) >> 3);
          auVar21._12_4_ = (uint)bVar1 * auVar23._12_4_ | (uint)!bVar1 * auVar28._12_4_;
          auVar27._16_4_ =
               (uint)(bVar6 & 1) * auVar23._16_4_ | (uint)!(bool)(bVar6 & 1) * auVar28._16_4_;
          auVar27._0_16_ = auVar21;
          bVar1 = (bool)(bVar5 >> 5 & 1);
          auVar27._20_4_ = (uint)bVar1 * auVar23._20_4_ | (uint)!bVar1 * auVar28._20_4_;
          bVar1 = (bool)(bVar5 >> 6 & 1);
          auVar27._24_4_ = (uint)bVar1 * auVar23._24_4_ | (uint)!bVar1 * auVar28._24_4_;
          auVar27._28_4_ =
               (uint)(bVar5 >> 7) * auVar23._28_4_ | (uint)!(bool)(bVar5 >> 7) * auVar28._28_4_;
          auVar21 = vpmaxsd_avx(auVar21,auVar27._16_16_);
          auVar29 = vpshufd_avx(auVar21,0xee);
          auVar21 = vpmaxsd_avx(auVar21,auVar29);
          auVar29 = vpsrlq_avx(auVar21,0x20);
          auVar21 = vpmaxsd_avx(auVar21,auVar29);
          iVar18 = auVar21._0_4_;
        }
        (&((local_150.tail)->super_ArrayIDFunc<int>).preimage_count_)[uVar16] = iVar18;
        uVar16 = uVar16 + 1;
      } while (uVar16 != (uVar19 & 0x7fffffff));
    }
    uVar16 = (ulong)((long)local_150.head - (long)local_150.tail) >> 2;
    iVar12 = (int)uVar16;
    if (iVar12 == 0) {
      piVar13 = (int *)0x0;
    }
    else {
      uVar17 = 0xffffffffffffffff;
      if (-1 < iVar12) {
        uVar17 = ((long)local_150.head - (long)local_150.tail) * 0x40000000 >> 0x1e &
                 0xfffffffffffffffc;
      }
      piVar13 = (int *)operator_new__(uVar17);
    }
    if (0 < iVar12) {
      auVar23 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar2 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar22 = vpbroadcastq_avx512vl();
      uVar17 = 0;
      auVar31._8_8_ = 8;
      auVar31._0_8_ = 8;
      auVar31._16_8_ = 8;
      auVar31._24_8_ = 8;
      auVar33._8_4_ = 8;
      auVar33._0_8_ = 0x800000008;
      auVar33._12_4_ = 8;
      auVar33._16_4_ = 8;
      auVar33._20_4_ = 8;
      auVar33._24_4_ = 8;
      auVar33._28_4_ = 8;
      do {
        vpcmpuq_avx512vl(auVar3,auVar22,2);
        vpcmpuq_avx512vl(auVar23,auVar22,2);
        auVar25 = vmovdqu32_avx512vl(auVar2);
        *(undefined1 (*) [32])(piVar13 + uVar17) = auVar25;
        uVar17 = uVar17 + 8;
        auVar3 = vpaddq_avx2(auVar3,auVar31);
        auVar23 = vpaddq_avx2(auVar23,auVar31);
        auVar2 = vpaddd_avx2(auVar2,auVar33);
      } while ((iVar12 + 7U & 0xfffffff8) != uVar17);
    }
    if ((uVar16 & 0xffffffff) != 0) {
      std::
      __introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<compute_separator_node_order(std::vector<int,std::allocator<int>>const&)::_lambda(int,int)_1_>>
                (piVar13,piVar13 + iVar12,(ulong)(uint)((int)LZCOUNT((long)iVar12) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_tree_depth_decomposition_h:235:43)>
                  )&local_150);
      std::
      __final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<compute_separator_node_order(std::vector<int,std::allocator<int>>const&)::_lambda(int,int)_1_>>
                (piVar13,piVar13 + iVar12,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_tree_depth_decomposition_h:235:43)>
                  )&local_150);
    }
    if (0 < (int)uVar19) {
      uVar16 = 0;
      do {
        lVar14 = (long)local_1ac;
        local_1ac = local_1ac + 1;
        local_198.super_ArrayIDFunc<int>.data_[lVar14] =
             local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[piVar13[uVar16]];
        uVar16 = uVar16 + 1;
      } while ((uVar19 & 0x7fffffff) != uVar16);
    }
    if (piVar13 != (int *)0x0) {
      operator_delete__(piVar13);
    }
    if (local_150.tail != (ArrayIDIDFunc *)0x0) {
      operator_delete(local_150.tail);
    }
  }
  tail_00 = local_130;
  if (local_110.data_ != (int *)0x0) {
    operator_delete__(local_110.data_);
  }
  if (local_100.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_100.super_ArrayIDFunc<int>.data_);
  }
  if (local_e8.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_e8.super_ArrayIDFunc<int>.data_);
  }
  if (local_168.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_168.super_ArrayIDFunc<int>.data_);
  }
  if (local_d0.data_.data_ != (unsigned_long *)0x0) {
    operator_delete__(local_d0.data_.data_);
  }
  if (local_58.intermediate_to_image.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_58.intermediate_to_image.super_ArrayIDFunc<int>.data_);
  }
  if (local_58.preimage_to_intermediate.range_begin.data_ != (int *)0x0) {
    operator_delete__(local_58.preimage_to_intermediate.range_begin.data_);
  }
  if ((local_198.super_ArrayIDFunc<int>.preimage_count_ != 0) &&
     (iVar12 = compute_tree_depth_of_order(tail_00,head_00,&local_198), iVar12 < local_1b4)) {
    if (local_180.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_180.super_ArrayIDFunc<int>.data_);
    }
    local_180.super_ArrayIDFunc<int>.preimage_count_ =
         local_198.super_ArrayIDFunc<int>.preimage_count_;
    local_198.super_ArrayIDFunc<int>.preimage_count_ = 0;
    local_180.super_ArrayIDFunc<int>.data_ = local_198.super_ArrayIDFunc<int>.data_;
    local_198.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    local_180.image_count_ = local_198.image_count_;
    local_1b4 = iVar12;
  }
  if (local_198.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_198.super_ArrayIDFunc<int>.data_);
  }
LAB_0011a9de:
  if (local_1b0 < local_1b4) {
    (__return_storage_ptr__->super_ArrayIDFunc<int>).preimage_count_ = 0;
    (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = (int *)0x0;
    iVar12 = 0;
  }
  else {
    (__return_storage_ptr__->super_ArrayIDFunc<int>).preimage_count_ =
         local_180.super_ArrayIDFunc<int>.preimage_count_;
    (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = local_180.super_ArrayIDFunc<int>.data_;
    local_180.super_ArrayIDFunc<int>.preimage_count_ = 0;
    local_180.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    iVar12 = local_180.image_count_;
  }
  __return_storage_ptr__->image_count_ = iVar12;
  if ((uint *)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_180.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_180.super_ArrayIDFunc<int>.data_);
  }
  return __return_storage_ptr__;
}

Assistant:

ArrayIDIDFunc compute_tree_depth_order_of_connected_graph(
    ArrayIDIDFunc tail, ArrayIDIDFunc head,
    const ComputeSeparator& compute_separator,
    int tree_depth_must_be_below)
{
    assert(tail.preimage_count() == head.preimage_count());
    assert(tail.image_count() == head.image_count());
    assert(is_symmetric(tail, head));

    const int node_count = tail.image_count();
    const int arc_count = tail.preimage_count();
    bool is_tree = (arc_count == 2 * (node_count - 1));
    bool is_clique = (arc_count == (node_count) * (node_count - 1));

    if (is_tree) {
        return compute_tree_depth_order_of_tree(std::move(tail), std::move(head));
    } else if (is_clique) {
        return identity_permutation(node_count);
    } else {
        ArrayIDIDFunc best_order = compute_greedy_order(tail, head);
        int best_order_depth = compute_tree_depth_of_order(tail, head, best_order);

        // If we computed a separator with size tree_depth_must_be_below or more, then the tree depth would also be at least tree_depth_must_be_below as the separator forms a path.
        // If we computed a separator with size best_order_depth or more, then it cannot be better than best_order_depth as the separator forms a path.
        std::vector<int> separator = compute_separator(tail, head, std::min(tree_depth_must_be_below, best_order_depth) - 1);
        if (!separator.empty()) {
            ArrayIDIDFunc nd_order = compute_nested_disection_order_by_splitting_along_separator(
                tail, head, separator,
                [&](ArrayIDIDFunc sub_tail, ArrayIDIDFunc sub_head) {
                    return compute_tree_depth_order_of_connected_graph(std::move(sub_tail), std::move(sub_head), compute_separator, std::min(tree_depth_must_be_below, best_order_depth) - 1);
                });
            if(nd_order.preimage_count() != 0){
                int nd_order_depth = compute_tree_depth_of_order(tail, head, nd_order);
                if (nd_order_depth < best_order_depth) {
                    best_order = std::move(nd_order);
                    best_order_depth = nd_order_depth;
                }
            }
        }

        if(best_order_depth > tree_depth_must_be_below)
            return ArrayIDIDFunc();
        else
            return std::move(best_order);
    }
}